

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O2

blargg_err_t __thiscall Blip_Buffer::set_sample_rate(Blip_Buffer *this,long new_rate,int msec)

{
  long lVar1;
  buf_t_ *pbVar2;
  long lVar3;
  
  if ((long)this->buffer_size_ == 1) {
    return "Internal (tried to resize Silent_Blip_Buffer)";
  }
  lVar3 = 0xffad;
  if ((msec != 0) && (lVar1 = (msec + 1) * new_rate, lVar1 < 0x3e6b7e1)) {
    lVar3 = (lVar1 + 999) / 1000;
  }
  if (lVar3 != this->buffer_size_) {
    pbVar2 = (buf_t_ *)realloc(this->buffer_,lVar3 * 4 + 0x48);
    if (pbVar2 == (buf_t_ *)0x0) {
      return "Out of memory";
    }
    this->buffer_ = pbVar2;
  }
  this->buffer_size_ = (blip_long)lVar3;
  this->sample_rate_ = new_rate;
  this->length_ = (int)((lVar3 * 1000) / new_rate) + -1;
  if (this->clock_rate_ != 0) {
    clock_rate(this,this->clock_rate_);
  }
  bass_freq(this,this->bass_freq_);
  clear(this,1);
  return (blargg_err_t)0x0;
}

Assistant:

Blip_Buffer::blargg_err_t Blip_Buffer::set_sample_rate( long new_rate, int msec )
{
	if ( buffer_size_ == silent_buf_size )
	{
		assert( 0 );
		return "Internal (tried to resize Silent_Blip_Buffer)";
	}
	
	// start with maximum length that resampled time can represent
	long new_size = (UINT_MAX >> BLIP_BUFFER_ACCURACY) - blip_buffer_extra_ - 64;
	if ( msec != blip_max_length )
	{
		long s = (new_rate * (msec + 1) + 999) / 1000;
		if ( s < new_size )
			new_size = s;
		else
			assert( 0 ); // fails if requested buffer length exceeds limit
	}
	
	if ( buffer_size_ != new_size )
	{
		void* p = realloc( buffer_, (new_size + blip_buffer_extra_) * sizeof *buffer_ );
		if ( !p )
			return "Out of memory";
		buffer_ = (buf_t_*) p;
	}
	
	buffer_size_ = new_size;
	assert( buffer_size_ != silent_buf_size );
	
	// update things based on the sample rate
	sample_rate_ = new_rate;
	length_ = new_size * 1000 / new_rate - 1;
	if ( msec )
		assert( length_ == msec ); // ensure length is same as that passed in
	if ( clock_rate_ )
		clock_rate( clock_rate_ );
	bass_freq( bass_freq_ );
	
	clear();
	
	return 0; // success
}